

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O0

void gdImageGifCtx(gdImagePtr im,gdIOCtxPtr out)

{
  int GInterlace;
  int BitsPerPixel_00;
  int BitsPerPixel;
  int interlace;
  gdImagePtr tim;
  gdImagePtr pim;
  gdIOCtxPtr out_local;
  gdImagePtr im_local;
  
  tim = (gdImagePtr)0x0;
  GInterlace = im->interlace;
  _BitsPerPixel = im;
  if ((im->trueColor == 0) ||
     (_BitsPerPixel = gdImageCreatePaletteFromTrueColor(im,1,0x100), tim = _BitsPerPixel,
     _BitsPerPixel != (gdImagePtr)0x0)) {
    BitsPerPixel_00 = colorstobpp(_BitsPerPixel->colorsTotal);
    GIFEncode(out,_BitsPerPixel->sx,_BitsPerPixel->sy,GInterlace,0,_BitsPerPixel->transparent,
              BitsPerPixel_00,_BitsPerPixel->red,_BitsPerPixel->green,_BitsPerPixel->blue,
              _BitsPerPixel);
    if (tim != (gdImagePtr)0x0) {
      gdImageDestroy(tim);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifCtx(gdImagePtr im, gdIOCtxPtr out)
{
	gdImagePtr pim = 0, tim = im;
	int interlace, BitsPerPixel;
	interlace = im->interlace;

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
		acceptable result: mix down to a palette
		based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if(!pim) {
			return;
		}
		tim = pim;
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFEncode(
	    out, tim->sx, tim->sy, interlace, 0, tim->transparent, BitsPerPixel,
	    tim->red, tim->green, tim->blue, tim);

	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(	pim);
	}
}